

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

Result ONX_ModelTest::WorstResult(Result a,Result b)

{
  int iVar1;
  undefined3 in_register_00000031;
  undefined3 in_register_00000039;
  
  iVar1 = CONCAT31(in_register_00000031,b);
  if ((CONCAT31(in_register_00000039,a) != 0 || CONCAT31(in_register_00000031,b) == 0) &&
     (iVar1 = CONCAT31(in_register_00000039,a), a == Unset || b != Unset)) {
    if (a < b) {
      b = a;
    }
    return b;
  }
  return (Result)iVar1;
}

Assistant:

ONX_ModelTest::Result ONX_ModelTest::WorstResult(
  ONX_ModelTest::Result a,
  ONX_ModelTest::Result b
)
{
  if (ONX_ModelTest::Result::Unset == a && ONX_ModelTest::Result::Unset != b)
    return b;
  if (ONX_ModelTest::Result::Unset != a && ONX_ModelTest::Result::Unset == b)
    return a;
  return
    (static_cast<unsigned char>(a) < static_cast<unsigned char>(b))
    ? a : b;
}